

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall wabt::SharedValidator::OnBr(SharedValidator *this,Location *loc,Var *depth)

{
  Result RVar1;
  Result RVar2;
  
  this->expr_loc_ = loc;
  if (depth->type_ == Index) {
    RVar1 = TypeChecker::OnBr(&this->typechecker_,(depth->field_2).index_);
    RVar2.enum_._1_3_ = 0;
    RVar2.enum_._0_1_ = RVar1.enum_ == Error;
    return (Result)RVar2.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h",
                0x38,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnBr(const Location& loc, Var depth) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= typechecker_.OnBr(depth.index());
  return result;
}